

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utf_impl.cpp
# Opt level: O1

int32_t utf8_appendCharSafeBody_63(uint8_t *s,int32_t i,int32_t length,UChar32 c,UBool *pIsError)

{
  long lVar1;
  uint uVar2;
  byte bVar3;
  int iVar4;
  uint uVar5;
  int iVar6;
  byte *pbVar7;
  
  bVar3 = (byte)c;
  if ((uint)c < 0x800) {
    lVar1 = (long)i + 1;
    if ((int)lVar1 < length) {
      s[i] = (byte)((uint)c >> 6) | 0xc0;
      s[lVar1] = bVar3 & 0x3f | 0x80;
      return i + 2;
    }
  }
  else if ((uint)c < 0x10000) {
    if ((c & 0xf800U) != 0xd800 && i + 2 < length) {
      s[i] = (byte)((uint)c >> 0xc) | 0xe0;
      s[(long)i + 1] = (byte)((uint)c >> 6) & 0x3f | 0x80;
      s[(long)i + 2] = bVar3 & 0x3f | 0x80;
      return i + 3;
    }
  }
  else if (i + 3 < length && (uint)c < 0x110000) {
    s[i] = (byte)((uint)c >> 0x12) | 0xf0;
    s[(long)i + 1] = (byte)((uint)c >> 0xc) & 0x3f | 0x80;
    s[(long)i + 2] = (byte)((uint)c >> 6) & 0x3f | 0x80;
    s[(long)i + 3] = bVar3 & 0x3f | 0x80;
    return i + 4;
  }
  if (pIsError == (UBool *)0x0) {
    iVar4 = length - i;
    if (iVar4 == 0 || length < i) {
      return i;
    }
    iVar6 = 3;
    if (iVar4 < 3) {
      iVar6 = iVar4;
    }
    pbVar7 = s + i;
    uVar2 = utf8_errorValue[iVar6 - 1];
    if ((ulong)(iVar6 - 1) - 4 < 0xfffffffffffffffd) {
      *pbVar7 = (byte)uVar2;
      iVar4 = 1;
    }
    else {
      if (iVar4 < 3) {
        *pbVar7 = (byte)(uVar2 >> 6) | 0xc0;
        uVar5 = 1;
      }
      else {
        *pbVar7 = (byte)(uVar2 >> 0xc) | 0xe0;
        pbVar7[1] = (byte)(uVar2 >> 6) & 0x3f | 0x80;
        uVar5 = 2;
      }
      iVar4 = uVar5 + 1;
      pbVar7[uVar5] = (byte)uVar2 & 0x3f | 0x80;
    }
    return iVar4 + i;
  }
  *pIsError = '\x01';
  return i;
}

Assistant:

U_CAPI int32_t U_EXPORT2
utf8_appendCharSafeBody(uint8_t *s, int32_t i, int32_t length, UChar32 c, UBool *pIsError) {
    if((uint32_t)(c)<=0x7ff) {
        if((i)+1<(length)) {
            (s)[(i)++]=(uint8_t)(((c)>>6)|0xc0);
            (s)[(i)++]=(uint8_t)(((c)&0x3f)|0x80);
            return i;
        }
    } else if((uint32_t)(c)<=0xffff) {
        /* Starting with Unicode 3.2, surrogate code points must not be encoded in UTF-8. */
        if((i)+2<(length) && !U_IS_SURROGATE(c)) {
            (s)[(i)++]=(uint8_t)(((c)>>12)|0xe0);
            (s)[(i)++]=(uint8_t)((((c)>>6)&0x3f)|0x80);
            (s)[(i)++]=(uint8_t)(((c)&0x3f)|0x80);
            return i;
        }
    } else if((uint32_t)(c)<=0x10ffff) {
        if((i)+3<(length)) {
            (s)[(i)++]=(uint8_t)(((c)>>18)|0xf0);
            (s)[(i)++]=(uint8_t)((((c)>>12)&0x3f)|0x80);
            (s)[(i)++]=(uint8_t)((((c)>>6)&0x3f)|0x80);
            (s)[(i)++]=(uint8_t)(((c)&0x3f)|0x80);
            return i;
        }
    }
    /* c>0x10ffff or not enough space, write an error value */
    if(pIsError!=NULL) {
        *pIsError=TRUE;
    } else {
        length-=i;
        if(length>0) {
            int32_t offset;
            if(length>3) {
                length=3;
            }
            s+=i;
            offset=0;
            c=utf8_errorValue[length-1];
            U8_APPEND_UNSAFE(s, offset, c);
            i=i+offset;
        }
    }
    return i;
}